

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O3

string * __thiscall
cfd::core::Privkey::SignBitcoinMessageWithBase64
          (string *__return_storage_ptr__,Privkey *this,string *message)

{
  ByteData *data;
  ByteData local_28;
  
  SignBitcoinMessage(&local_28,this,message);
  CryptoUtil::EncodeBase64_abi_cxx11_((string *)__return_storage_ptr__,(CryptoUtil *)&local_28,data)
  ;
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Privkey::SignBitcoinMessageWithBase64(
    const std::string &message) const {
  return CryptoUtil::EncodeBase64(SignBitcoinMessage(message));
}